

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O2

VmConstant * CreateConstantLong(Allocator *allocator,SynBase *source,longlong value)

{
  int iVar1;
  undefined4 extraout_var;
  VmConstant *this;
  
  iVar1 = (*allocator->_vptr_Allocator[2])(allocator,0xd8);
  this = (VmConstant *)CONCAT44(extraout_var,iVar1);
  VmConstant::VmConstant(this,allocator,(VmType)ZEXT816((ulong)0x800000003),source);
  this->lValue = value;
  return this;
}

Assistant:

VmConstant* CreateConstantLong(Allocator *allocator, SynBase *source, long long value)
{
	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Long, source);

	result->lValue = value;

	return result;
}